

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::recursivelyWrapLine(ostream *os,string *paragraph,size_t columns,size_t indent)

{
  long *plVar1;
  char cVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  long *local_c0;
  long local_b8;
  long local_b0;
  undefined8 uStack_a8;
  ulong local_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  size_t local_58;
  string local_50;
  
  uVar5 = paragraph->_M_string_length;
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    local_a0 = columns - indent;
    local_58 = columns;
    do {
      if (uVar6 == columns - indent) {
        if (indent != 0) {
          sVar8 = indent;
          do {
            local_c0 = (long *)CONCAT71(local_c0._1_7_,0x20);
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c0,1);
            sVar8 = sVar8 - 1;
          } while (sVar8 != 0);
        }
        std::__cxx11::string::substr((ulong)&local_c0,(ulong)paragraph);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_c0,local_b8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        sVar8 = local_58;
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        std::__cxx11::string::substr((ulong)&local_50,(ulong)paragraph);
        recursivelyWrapLine(os,&local_50,sVar8,uVar7 + indent);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p == &local_50.field_2) {
          return;
        }
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        return;
      }
      cVar2 = (paragraph->_M_dataplus)._M_p[uVar6];
      if (cVar2 == '\t') {
        std::__cxx11::string::substr((ulong)&local_78,(ulong)paragraph);
        std::__cxx11::string::substr((ulong)&local_98,(ulong)paragraph);
        uVar5 = 0xf;
        if (local_78 != local_68) {
          uVar5 = local_68[0];
        }
        if (uVar5 < (ulong)(local_90 + local_70)) {
          uVar5 = 0xf;
          if (local_98 != local_88) {
            uVar5 = local_88[0];
          }
          if (uVar5 < (ulong)(local_90 + local_70)) goto LAB_0013141e;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
        }
        else {
LAB_0013141e:
          puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
        }
        plVar1 = puVar3 + 2;
        if ((long *)*puVar3 == plVar1) {
          local_b0 = *plVar1;
          uStack_a8 = puVar3[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *plVar1;
          local_c0 = (long *)*puVar3;
        }
        local_b8 = puVar3[1];
        *puVar3 = plVar1;
        puVar3[1] = 0;
        *(undefined1 *)plVar1 = 0;
        std::__cxx11::string::operator=((string *)paragraph,(string *)&local_c0);
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        uVar5 = paragraph->_M_string_length;
        uVar7 = uVar6;
      }
      else {
        if (cVar2 == ' ') {
          local_a0 = uVar6;
        }
        uVar6 = uVar6 + 1;
      }
    } while (uVar6 < uVar5);
  }
  if (indent != 0) {
    do {
      local_c0 = (long *)CONCAT71(local_c0._1_7_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c0,1);
      indent = indent - 1;
    } while (indent != 0);
    uVar5 = paragraph->_M_string_length;
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(paragraph->_M_dataplus)._M_p,uVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return;
}

Assistant:

inline void recursivelyWrapLine( std::ostream& os, std::string paragraph, std::size_t columns, std::size_t indent ) {
        std::size_t width = columns-indent;
        std::size_t tab = 0;
        std::size_t wrapPoint = width;
        for( std::size_t pos = 0; pos < paragraph.size(); ++pos ) {
            if( pos == width ) {
                addIndent( os, indent );
                os << paragraph.substr( 0, wrapPoint ) << "\n";
                return recursivelyWrapLine( os, paragraph.substr( wrapPoint+1 ), columns, indent+tab );
            }
            if( paragraph[pos] == '\t' ) {
                    tab = pos;
                    paragraph = paragraph.substr( 0, tab ) + paragraph.substr( tab+1 );
                    pos--;
            }
            else if( paragraph[pos] == ' ' ) {
                wrapPoint = pos;
            }
        }
        addIndent( os, indent );
        os << paragraph << "\n";
    }